

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O2

uint256 * __thiscall
anon_unknown.dwarf_12d03c0::Scenario::NewTxHash
          (uint256 *__return_storage_ptr__,Scenario *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *orders)

{
  pointer pvVar1;
  pointer plVar2;
  base_blob<256U> *pbVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  pointer pvVar6;
  size_t pos;
  ulong uVar7;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<uint256>,_bool> pVar8;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x10] = '\0';
  (pbVar3->m_data)._M_elems[0x11] = '\0';
  (pbVar3->m_data)._M_elems[0x12] = '\0';
  (pbVar3->m_data)._M_elems[0x13] = '\0';
  (pbVar3->m_data)._M_elems[0x14] = '\0';
  (pbVar3->m_data)._M_elems[0x15] = '\0';
  (pbVar3->m_data)._M_elems[0x16] = '\0';
  (pbVar3->m_data)._M_elems[0x17] = '\0';
  pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[0x18] = '\0';
  (pbVar3->m_data)._M_elems[0x19] = '\0';
  (pbVar3->m_data)._M_elems[0x1a] = '\0';
  (pbVar3->m_data)._M_elems[0x1b] = '\0';
  (pbVar3->m_data)._M_elems[0x1c] = '\0';
  (pbVar3->m_data)._M_elems[0x1d] = '\0';
  (pbVar3->m_data)._M_elems[0x1e] = '\0';
  (pbVar3->m_data)._M_elems[0x1f] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar3 = &__return_storage_ptr__->super_base_blob<256U>;
  (pbVar3->m_data)._M_elems[8] = '\0';
  (pbVar3->m_data)._M_elems[9] = '\0';
  (pbVar3->m_data)._M_elems[10] = '\0';
  (pbVar3->m_data)._M_elems[0xb] = '\0';
  (pbVar3->m_data)._M_elems[0xc] = '\0';
  (pbVar3->m_data)._M_elems[0xd] = '\0';
  (pbVar3->m_data)._M_elems[0xe] = '\0';
  (pbVar3->m_data)._M_elems[0xf] = '\0';
LAB_0055f9ad:
  do {
    RandomMixin<FastRandomContext>::rand256
              (&local_58,&this->m_rng->super_RandomMixin<FastRandomContext>);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         local_58.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) =
         local_58.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems =
         local_58.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_;
    pvVar1 = (orders->
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar6 = (orders->
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar6 != pvVar1; pvVar6 = pvVar6 + 1)
    {
      uVar7 = 1;
      while (plVar2 = (pvVar6->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_start,
            uVar7 < (ulong)((long)(pvVar6->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)plVar2 >> 3)) {
        uVar4 = TxRequestTracker::ComputePriority
                          (&this->m_runner->txrequest,__return_storage_ptr__,plVar2[uVar7 - 1],true)
        ;
        uVar5 = TxRequestTracker::ComputePriority
                          (&this->m_runner->txrequest,__return_storage_ptr__,
                           (pvVar6->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar7],true);
        uVar7 = uVar7 + 1;
        if (uVar4 <= uVar5) goto LAB_0055f9ad;
      }
    }
    pVar8 = std::
            _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
            ::_M_insert_unique<uint256_const&>
                      ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                        *)&this->m_runner->txhashset,__return_storage_ptr__);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

uint256 NewTxHash(const std::vector<std::vector<NodeId>>& orders = {})
    {
        uint256 ret;
        bool ok;
        do {
            ret = m_rng.rand256();
            ok = true;
            for (const auto& order : orders) {
                for (size_t pos = 1; pos < order.size(); ++pos) {
                    uint64_t prio_prev = m_runner.txrequest.ComputePriority(ret, order[pos - 1], true);
                    uint64_t prio_cur = m_runner.txrequest.ComputePriority(ret, order[pos], true);
                    if (prio_prev <= prio_cur) {
                        ok = false;
                        break;
                    }
                }
                if (!ok) break;
            }
            if (ok) {
                ok = m_runner.txhashset.insert(ret).second;
            }
        } while(!ok);
        return ret;
    }